

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dungeon.c
# Opt level: O0

int find_branch(char *s,proto_dungeon *pd)

{
  char cVar1;
  xchar xVar2;
  xchar xVar3;
  int iVar4;
  uint local_34;
  char *dnam;
  branch *br;
  int i;
  proto_dungeon *pd_local;
  char *s_local;
  
  if (pd == (proto_dungeon *)0x0) {
    for (dnam = (char *)branches; dnam != (char *)0x0; dnam = *(char **)dnam) {
      cVar1 = dnam[0x12];
      iVar4 = strncasecmp(dungeons[cVar1].dname,s,0xffffffffffffffff);
      if ((iVar4 == 0) ||
         ((iVar4 = strncasecmp(dungeons[cVar1].dname,"The ",4), iVar4 == 0 &&
          (iVar4 = strncasecmp(dungeons[cVar1].dname + 4,s,0xffffffffffffffff), iVar4 == 0))))
      break;
    }
    if (dnam == (char *)0x0) {
      local_34 = 0xffffffff;
    }
    else {
      xVar2 = ledger_no((d_level *)(dnam + 0x10));
      xVar3 = ledger_no((d_level *)(dnam + 0x12));
      local_34 = (int)xVar2 << 8 | (int)xVar3;
    }
    br._4_4_ = local_34;
  }
  else {
    br._4_4_ = 0;
    while (((int)br._4_4_ < pd->n_brs &&
           (iVar4 = strcmp(pd->tmpbranch[(int)br._4_4_].name,s), iVar4 != 0))) {
      br._4_4_ = br._4_4_ + 1;
    }
    if (br._4_4_ == pd->n_brs) {
      panic("find_branch: can\'t find %s",s);
    }
  }
  return br._4_4_;
}

Assistant:

static int find_branch(const char *s, /* dungeon name */
		       struct proto_dungeon *pd)
{
	int i;

	if (pd) {
	    for (i = 0; i < pd->n_brs; i++)
		if (!strcmp(pd->tmpbranch[i].name, s)) break;
	    if (i == pd->n_brs) panic("find_branch: can't find %s", s);
	} else {
	    /* support for level tport by name */
	    branch *br;
	    const char *dnam;

	    for (br = branches; br; br = br->next) {
		dnam = dungeons[br->end2.dnum].dname;
		if (!strcmpi(dnam, s) ||
			(!strncmpi(dnam, "The ", 4) && !strcmpi(dnam + 4, s)))
		    break;
	    }
	    i = br ? ((ledger_no(&br->end1) << 8) | ledger_no(&br->end2)) : -1;
	}
	return i;
}